

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Runner::makeReporter(Runner *this)

{
  bool bVar1;
  int iVar2;
  Config *pCVar3;
  ulong uVar4;
  IRegistryHub *pIVar5;
  undefined4 extraout_var;
  IStreamingReporter *p;
  ostream *poVar6;
  domain_error *this_00;
  string local_208 [32];
  ostringstream local_1e8 [8];
  ostringstream oss;
  Ptr<Catch::IConfig> local_70 [3];
  byte local_52;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string reporterName;
  Runner *this_local;
  
  reporterName.field_2._8_8_ = this;
  pCVar3 = Ptr<Catch::Config>::operator->(&this->m_config);
  Config::getReporterName_abi_cxx11_(&local_50,pCVar3);
  uVar4 = std::__cxx11::string::empty();
  local_52 = 0;
  if ((uVar4 & 1) == 0) {
    pCVar3 = Ptr<Catch::Config>::operator->(&this->m_config);
    Config::getReporterName_abi_cxx11_((string *)local_30,pCVar3);
  }
  else {
    std::allocator<char>::allocator();
    local_52 = 1;
    std::__cxx11::string::string((string *)local_30,"console",&local_51);
  }
  if ((local_52 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  std::__cxx11::string::~string((string *)&local_50);
  pIVar5 = getRegistryHub();
  iVar2 = (*pIVar5->_vptr_IRegistryHub[2])();
  pCVar3 = Ptr<Catch::Config>::get(&this->m_config);
  Ptr<Catch::IConfig>::Ptr(local_70,(IConfig *)pCVar3);
  p = (IStreamingReporter *)
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
                ((long *)CONCAT44(extraout_var,iVar2),local_30,local_70);
  Ptr<Catch::IStreamingReporter>::operator=(&this->m_reporter,p);
  Ptr<Catch::IConfig>::~Ptr(local_70);
  bVar1 = Ptr<Catch::IStreamingReporter>::operator!(&this->m_reporter);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1e8);
    poVar6 = std::operator<<((ostream *)local_1e8,"No reporter registered with name: \'");
    poVar6 = std::operator<<(poVar6,(string *)local_30);
    std::operator<<(poVar6,"\'");
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::domain_error::domain_error(this_00,local_208);
    __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void makeReporter() {
            std::string reporterName = m_config->getReporterName().empty()
                ? "console"
                : m_config->getReporterName();

            m_reporter = getRegistryHub().getReporterRegistry().create( reporterName, m_config.get() );
            if( !m_reporter ) {
                std::ostringstream oss;
                oss << "No reporter registered with name: '" << reporterName << "'";
                throw std::domain_error( oss.str() );
            }
        }